

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_add_item_to_object_should_not_use_after_free_when_string_is_aliased(void)

{
  cJSON *object;
  cJSON *item;
  char *string;
  cJSON_bool in_R8D;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 8;
    item->valuedouble = 42.0;
    item->valueint = 0x2a;
  }
  string = (char *)(*global_hooks.allocate)(7);
  if (string == (char *)0x0) {
    string = (char *)0x0;
  }
  else {
    builtin_strncpy(string,"number",7);
  }
  if (object == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x23b);
  }
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x23c);
  }
  if (string == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x23d);
  }
  item->string = string;
  add_item_to_object(object,string,item,(internal_hooks *)0x0,in_R8D);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_item_to_object_should_not_use_after_free_when_string_is_aliased(void)
{
    cJSON *object = cJSON_CreateObject();
    cJSON *number = cJSON_CreateNumber(42);
    char *name = (char*)cJSON_strdup((const unsigned char*)"number", &global_hooks);

    TEST_ASSERT_NOT_NULL(object);
    TEST_ASSERT_NOT_NULL(number);
    TEST_ASSERT_NOT_NULL(name);

    number->string = name;

    /* The following should not have a use after free
     * that would show up in valgrind or with AddressSanitizer */
    cJSON_AddItemToObject(object, number->string, number);

    cJSON_Delete(object);
}